

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Parser_Y.cpp
# Opt level: O2

void amrex::parser_ast_print(parser_node *node,string *space,AllPrint *printer)

{
  ostringstream *poVar1;
  parser_node *ppVar2;
  uint uVar3;
  ostream *poVar4;
  Print *pPVar5;
  Print *pPVar6;
  char *pcVar7;
  long lStack_1f0;
  undefined1 auStack_1e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  Print local_1a8;
  
  pPVar6 = (Print *)auStack_1e8;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (auStack_1e8 + 0x20),space,"  ");
  switch(node->type) {
  case PARSER_NUMBER:
    poVar1 = &(printer->super_Print).ss;
    std::operator<<((ostream *)poVar1,(string *)space);
    std::operator<<((ostream *)poVar1,"NUMBER: ");
    pPVar6 = Print::operator<<(&printer->super_Print,(double *)&node->l);
    goto LAB_005d5b83;
  case PARSER_SYMBOL:
    poVar1 = &(printer->super_Print).ss;
    std::operator<<((ostream *)poVar1,(string *)space);
    std::operator<<((ostream *)poVar1,"VARIABLE: ");
    goto LAB_005d5b74;
  case PARSER_ADD:
    std::operator<<((ostream *)&(printer->super_Print).ss,(string *)space);
    pcVar7 = "ADD\n";
    goto LAB_005d5997;
  case PARSER_SUB:
    std::operator<<((ostream *)&(printer->super_Print).ss,(string *)space);
    pcVar7 = "SUB\n";
    goto LAB_005d5997;
  case PARSER_MUL:
    std::operator<<((ostream *)&(printer->super_Print).ss,(string *)space);
    pcVar7 = "MUL\n";
    goto LAB_005d5997;
  case PARSER_DIV:
    std::operator<<((ostream *)&(printer->super_Print).ss,(string *)space);
    pcVar7 = "DIV\n";
    goto LAB_005d5997;
  case PARSER_NEG:
    poVar1 = &(printer->super_Print).ss;
    std::operator<<((ostream *)poVar1,(string *)space);
    std::operator<<((ostream *)poVar1,"NEG\n");
    lStack_1f0 = 8;
    goto LAB_005d59b2;
  case PARSER_F1:
    poVar1 = &(printer->super_Print).ss;
    std::operator<<((ostream *)poVar1,(string *)space);
    uVar3 = *(int *)&node->r - 1;
    if (uVar3 < 0x16) {
      std::operator<<((ostream *)poVar1,&DAT_00621b98 + *(int *)(&DAT_00621b98 + (ulong)uVar3 * 4));
    }
    else {
      poVar4 = OutStream();
      AllPrint::AllPrint((AllPrint *)&local_1a8,poVar4);
      std::operator<<((ostream *)&local_1a8.ss,"parser_ast_print_f1: Unknown function ");
      pPVar6 = Print::operator<<(&local_1a8,(parser_f1_t *)&node->r);
      std::operator<<((ostream *)&pPVar6->ss,"\n");
      Print::~Print(&local_1a8);
    }
    ppVar2 = node->l;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1a8,
                   space,"  ");
    parser_ast_print(ppVar2,(string *)&local_1a8,printer);
    goto LAB_005d5cbe;
  case PARSER_F2:
    poVar1 = &(printer->super_Print).ss;
    std::operator<<((ostream *)poVar1,(string *)space);
    uVar3 = (node->lvp).ip - 1;
    if (uVar3 < 0xe) {
      std::operator<<((ostream *)poVar1,&DAT_00621bf0 + *(int *)(&DAT_00621bf0 + (ulong)uVar3 * 4));
    }
    else {
      poVar4 = OutStream();
      AllPrint::AllPrint((AllPrint *)&local_1a8,poVar4);
      std::operator<<((ostream *)&local_1a8.ss,"parser_ast_print_f2: Unknown function ");
      pPVar6 = Print::operator<<(&local_1a8,(parser_f2_t *)&(node->lvp).ip);
      std::operator<<((ostream *)&pPVar6->ss,"\n");
      Print::~Print(&local_1a8);
    }
    ppVar2 = node->l;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1a8,
                   space,"  ");
    parser_ast_print(ppVar2,(string *)&local_1a8,printer);
    std::__cxx11::string::~string((string *)&local_1a8);
    ppVar2 = node->r;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1a8,
                   space,"  ");
    parser_ast_print(ppVar2,(string *)&local_1a8,printer);
LAB_005d5cbe:
    pPVar6 = &local_1a8;
    goto LAB_005d5d13;
  case PARSER_F3:
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_1e8,
                   space,"  ");
    if (node->rip == 0) {
      poVar1 = &(printer->super_Print).ss;
      std::operator<<((ostream *)poVar1,(string *)space);
      std::operator<<((ostream *)poVar1,"IF\n");
    }
    else {
      poVar4 = OutStream();
      AllPrint::AllPrint((AllPrint *)&local_1a8,poVar4);
      std::operator<<((ostream *)&local_1a8.ss,"parser_ast_print_f3: Unknown function ");
      pPVar5 = Print::operator<<(&local_1a8,(parser_f3_t *)&node->rip);
      std::operator<<((ostream *)&pPVar5->ss,"\n");
      Print::~Print(&local_1a8);
    }
    parser_ast_print(node->l,(string *)auStack_1e8,printer);
    parser_ast_print(node->r,(string *)auStack_1e8,printer);
    parser_ast_print((node->lvp).n,(string *)auStack_1e8,printer);
    goto LAB_005d5d13;
  case PARSER_ASSIGN:
    poVar1 = &(printer->super_Print).ss;
    std::operator<<((ostream *)poVar1,(string *)space);
    std::operator<<((ostream *)poVar1,"=: ");
    pPVar6 = Print::operator<<(&printer->super_Print,(char **)&node->l->l);
    std::operator<<((ostream *)&pPVar6->ss," =\n");
    goto LAB_005d59b0;
  case PARSER_LIST:
    std::operator<<((ostream *)&(printer->super_Print).ss,(string *)space);
    pcVar7 = "LIST\n";
LAB_005d5997:
    std::operator<<((ostream *)&(printer->super_Print).ss,pcVar7);
    parser_ast_print(node->l,(string *)(auStack_1e8 + 0x20),printer);
LAB_005d59b0:
    lStack_1f0 = 0x10;
LAB_005d59b2:
    parser_ast_print(*(parser_node **)((long)&node->type + lStack_1f0),
                     (string *)(auStack_1e8 + 0x20),printer);
    goto LAB_005d5d18;
  case PARSER_ADD_VP:
    poVar1 = &(printer->super_Print).ss;
    std::operator<<((ostream *)poVar1,(string *)space);
    std::operator<<((ostream *)poVar1,"ADD: ");
    printer = (AllPrint *)Print::operator<<(&printer->super_Print,&(node->lvp).v);
    std::operator<<((ostream *)&((Print *)printer)->ss," ");
    break;
  case PARSER_ADD_PP:
    poVar1 = &(printer->super_Print).ss;
    std::operator<<((ostream *)poVar1,(string *)space);
    std::operator<<((ostream *)poVar1,"ADD: ");
    printer = (AllPrint *)Print::operator<<(&printer->super_Print,(char **)&node->l->l);
    std::operator<<((ostream *)&((Print *)printer)->ss,"  ");
    break;
  case PARSER_SUB_VP:
    poVar1 = &(printer->super_Print).ss;
    std::operator<<((ostream *)poVar1,(string *)space);
    std::operator<<((ostream *)poVar1,"SUB: ");
    printer = (AllPrint *)Print::operator<<(&printer->super_Print,&(node->lvp).v);
    std::operator<<((ostream *)&((Print *)printer)->ss," ");
    break;
  case PARSER_SUB_PP:
    poVar1 = &(printer->super_Print).ss;
    std::operator<<((ostream *)poVar1,(string *)space);
    std::operator<<((ostream *)poVar1,"SUB: ");
    printer = (AllPrint *)Print::operator<<(&printer->super_Print,(char **)&node->l->l);
    std::operator<<((ostream *)&((Print *)printer)->ss,"  ");
    break;
  case PARSER_MUL_VP:
    poVar1 = &(printer->super_Print).ss;
    std::operator<<((ostream *)poVar1,(string *)space);
    std::operator<<((ostream *)poVar1,"MUL: ");
    printer = (AllPrint *)Print::operator<<(&printer->super_Print,&(node->lvp).v);
    std::operator<<((ostream *)&((Print *)printer)->ss," ");
    break;
  case PARSER_MUL_PP:
    poVar1 = &(printer->super_Print).ss;
    std::operator<<((ostream *)poVar1,(string *)space);
    std::operator<<((ostream *)poVar1,"MUL: ");
    printer = (AllPrint *)Print::operator<<(&printer->super_Print,(char **)&node->l->l);
    std::operator<<((ostream *)&((Print *)printer)->ss,"  ");
    break;
  case PARSER_DIV_VP:
    poVar1 = &(printer->super_Print).ss;
    std::operator<<((ostream *)poVar1,(string *)space);
    std::operator<<((ostream *)poVar1,"DIV: ");
    printer = (AllPrint *)Print::operator<<(&printer->super_Print,&(node->lvp).v);
    std::operator<<((ostream *)&((Print *)printer)->ss," ");
    break;
  case PARSER_DIV_PP:
    poVar1 = &(printer->super_Print).ss;
    std::operator<<((ostream *)poVar1,(string *)space);
    std::operator<<((ostream *)poVar1,"DIV: ");
    printer = (AllPrint *)Print::operator<<(&printer->super_Print,(char **)&node->l->l);
    std::operator<<((ostream *)&((Print *)printer)->ss,"  ");
    break;
  case PARSER_NEG_P:
    poVar1 = &(printer->super_Print).ss;
    std::operator<<((ostream *)poVar1,(string *)space);
    std::operator<<((ostream *)poVar1,"NEG: ");
    lStack_1f0 = 8;
    goto LAB_005d5b6f;
  default:
    std::__cxx11::to_string((string *)auStack_1e8,node->type);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1a8,
                   "parser_ast_print: unknown node type ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_1e8)
    ;
    Abort((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    pPVar6 = (Print *)auStack_1e8;
LAB_005d5d13:
    std::__cxx11::string::~string((string *)pPVar6);
    goto LAB_005d5d18;
  }
  lStack_1f0 = 0x10;
LAB_005d5b6f:
  node = *(parser_node **)((long)&node->type + lStack_1f0);
LAB_005d5b74:
  pPVar6 = Print::operator<<(&printer->super_Print,(char **)&node->l);
LAB_005d5b83:
  std::operator<<((ostream *)&pPVar6->ss,"\n");
LAB_005d5d18:
  std::__cxx11::string::~string((string *)(auStack_1e8 + 0x20));
  return;
}

Assistant:

void
parser_ast_print (struct parser_node* node, std::string const& space, AllPrint& printer)
{
    std::string const& more_space = space + "  ";
    switch (node->type)
    {
    case PARSER_NUMBER:
        printer << space << "NUMBER: " << ((struct parser_number*)node)->value << "\n";
        break;
    case PARSER_SYMBOL:
        printer << space << "VARIABLE: " << ((struct parser_symbol*)node)->name << "\n";
        break;
    case PARSER_ADD:
        printer << space << "ADD\n";
        parser_ast_print(node->l, more_space, printer);
        parser_ast_print(node->r, more_space, printer);
        break;
    case PARSER_SUB:
        printer << space << "SUB\n";
        parser_ast_print(node->l, more_space, printer);
        parser_ast_print(node->r, more_space, printer);
        break;
    case PARSER_MUL:
        printer << space << "MUL\n";
        parser_ast_print(node->l, more_space, printer);
        parser_ast_print(node->r, more_space, printer);
        break;
    case PARSER_DIV:
        printer << space << "DIV\n";
        parser_ast_print(node->l, more_space, printer);
        parser_ast_print(node->r, more_space, printer);
        break;
    case PARSER_NEG:
        printer << space << "NEG\n";
        parser_ast_print(node->l, more_space, printer);
        break;
    case PARSER_F1:
        parser_ast_print_f1((struct parser_f1*)node, space, printer);
        break;
    case PARSER_F2:
        parser_ast_print_f2((struct parser_f2*)node, space, printer);
        break;
    case PARSER_F3:
        parser_ast_print_f3((struct parser_f3*)node, space, printer);
        break;
    case PARSER_ASSIGN:
        printer << space << "=: " << ((struct parser_assign*)node)->s->name << " =\n";
        parser_ast_print(((struct parser_assign*)node)->v, more_space, printer);
        break;
    case PARSER_LIST:
        printer << space <<"LIST\n";
        parser_ast_print(node->l, more_space, printer);
        parser_ast_print(node->r, more_space, printer);
        break;
    case PARSER_ADD_VP:
        printer << space << "ADD: " << node->lvp.v << " "
                << ((struct parser_symbol*)(node->r))->name << "\n";
        break;
    case PARSER_SUB_VP:
        printer << space << "SUB: " << node->lvp.v << " "
                << ((struct parser_symbol*)(node->r))->name << "\n";
        break;
    case PARSER_MUL_VP:
        printer << space << "MUL: " << node->lvp.v << " "
                << ((struct parser_symbol*)(node->r))->name << "\n";
        break;
    case PARSER_DIV_VP:
        printer << space << "DIV: " << node->lvp.v << " "
                << ((struct parser_symbol*)(node->r))->name << "\n";
        break;
    case PARSER_NEG_P:
        printer << space << "NEG: " << ((struct parser_symbol*)(node->l))->name << "\n";
        break;
    case PARSER_ADD_PP:
        printer << space << "ADD: " << ((struct parser_symbol*)(node->l))->name
                << "  "             << ((struct parser_symbol*)(node->r))->name << "\n";
        break;
    case PARSER_SUB_PP:
        printer << space << "SUB: " << ((struct parser_symbol*)(node->l))->name
                << "  "             << ((struct parser_symbol*)(node->r))->name << "\n";
        break;
    case PARSER_MUL_PP:
        printer << space << "MUL: " << ((struct parser_symbol*)(node->l))->name
                << "  "             << ((struct parser_symbol*)(node->r))->name << "\n";
        break;
    case PARSER_DIV_PP:
        printer << space << "DIV: " << ((struct parser_symbol*)(node->l))->name
                << "  "             << ((struct parser_symbol*)(node->r))->name << "\n";
        break;
    default:
        amrex::Abort("parser_ast_print: unknown node type " + std::to_string(node->type));
    }
}